

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QVariant * __thiscall
QAbstractItemView::inputMethodQuery
          (QVariant *__return_storage_ptr__,QAbstractItemView *this,InputMethodQuery query)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QWidget *this_01;
  int iVar2;
  QEditorInfo *pQVar3;
  QPoint QVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QPoint local_80;
  QModelIndex local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex(&local_78,this);
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (((local_78.r < 0) || ((long)local_78._0_8_ < 0)) ||
     (local_78.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_004e111b;
  if (this_00->waitForIMCommit == true) {
    pQVar3 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_78);
    pDVar1 = (pQVar3->widget).wp.d;
    if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
       (this_01 = (QWidget *)(pQVar3->widget).wp.value, this_01 == (QWidget *)0x0))
    goto LAB_004e10e2;
    (**(code **)(*(long *)this_01 + 400))(&local_58,this_01,query);
    ::QVariant::operator=(__return_storage_ptr__,&local_58);
    ::QVariant::~QVariant(&local_58);
    iVar2 = ::QVariant::typeId(__return_storage_ptr__);
    if (iVar2 != 0x13) goto LAB_004e111b;
    QVar6 = qvariant_cast<QRect>(__return_storage_ptr__);
    local_80 = QVar6._0_8_;
    QVar4 = QWidget::mapTo(this_01,(QWidget *)this,&local_80);
    uVar5 = (ulong)(uint)((QVar6.x2.m_i.m_i - QVar6.x1.m_i) + QVar4.xp.m_i.m_i) |
            (QVar6._8_8_ - ((ulong)QVar6._0_8_ & 0xffffffff00000000) & 0xffffffff00000000) +
            (long)QVar4 & 0xffffffff00000000;
    QVar6.x2.m_i = (int)uVar5;
    QVar6.y2.m_i = (int)(uVar5 >> 0x20);
    QVar6.x1.m_i = QVar4.xp.m_i;
    QVar6.y1.m_i = QVar4.yp.m_i;
  }
  else {
LAB_004e10e2:
    if (query != ImCursorRectangle) goto LAB_004e111b;
    QVar6 = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,&local_78);
  }
  ::QVariant::QVariant(&local_58,QVar6);
  ::QVariant::operator=(__return_storage_ptr__,&local_58);
  ::QVariant::~QVariant(&local_58);
LAB_004e111b:
  if (*(ulong *)&(__return_storage_ptr__->d).field_0x18 < 4) {
    QWidget::inputMethodQuery(&local_58,(QWidget *)this,query);
    ::QVariant::operator=(__return_storage_ptr__,&local_58);
    ::QVariant::~QVariant(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractItemView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QAbstractItemView);
    const QModelIndex current = currentIndex();
    QVariant result;
    if (current.isValid()) {
        if (QWidget *currentEditor;
            d->waitForIMCommit && (currentEditor = d->editorForIndex(current).widget)) {
            // An editor is open but the initial preedit is still ongoing. Delegate
            // queries to the editor and map coordinates from editor to this view.
            result = currentEditor->inputMethodQuery(query);
            if (result.typeId() == QMetaType::QRect) {
                const QRect editorRect = result.value<QRect>();
                result = QRect(currentEditor->mapTo(this, editorRect.topLeft()), editorRect.size());
            }
        } else if (query == Qt::ImCursorRectangle) {
            result = visualRect(current);
        }
    }
    if (!result.isValid())
        result = QAbstractScrollArea::inputMethodQuery(query);
    return result;
}